

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O0

void run_init(wchar_t dir)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  uint uVar5;
  loc grid_00;
  _Bool local_1a;
  _Bool local_19;
  _Bool shortright;
  _Bool shortleft;
  _Bool deepright;
  _Bool deepleft;
  loc grid;
  wchar_t i;
  wchar_t dir_local;
  
  player->upkeep->running_firststep = true;
  run_cur_dir = dir;
  run_old_dir = dir;
  wVar4 = level_topography((int)player->place);
  if ((wVar4 == L'\a') || (wVar4 = level_topography((int)player->place), wVar4 == L'\0')) {
    run_open_area = true;
    run_break_right = false;
    run_break_left = false;
    local_1a = false;
    local_19 = false;
    bVar1 = false;
    bVar2 = false;
    grid_00 = loc_sum(player->grid,ddgrid[dir]);
    uVar5 = (uint)""[dir];
    _Var3 = see_wall((uint)"\x01\x02\x03\x06\t\b\a\x04\x01\x02\x03\x06\t\b\a\x04\x01"
                           [(int)(uVar5 + 1)],player->grid);
    if (_Var3) {
      run_break_left = true;
      bVar1 = true;
    }
    else {
      local_19 = see_wall((uint)"\x01\x02\x03\x06\t\b\a\x04\x01\x02\x03\x06\t\b\a\x04\x01"
                                [(int)(uVar5 + 1)],grid_00);
      if (local_19) {
        run_break_left = true;
      }
    }
    _Var3 = see_wall((uint)"\x01\x02\x03\x06\t\b\a\x04\x01\x02\x03\x06\t\b\a\x04\x01"
                           [(int)(uVar5 - 1)],player->grid);
    if (_Var3) {
      run_break_right = true;
      bVar2 = true;
    }
    else {
      local_1a = see_wall((uint)"\x01\x02\x03\x06\t\b\a\x04\x01\x02\x03\x06\t\b\a\x04\x01"
                                [(int)(uVar5 - 1)],grid_00);
      if (local_1a) {
        run_break_right = true;
      }
    }
    if (((run_break_left & 1U) != 0) && ((run_break_right & 1U) != 0)) {
      run_open_area = false;
      if ((dir & 1U) == 0) {
        _Var3 = see_wall((uint)"\x01\x02\x03\x06\t\b\a\x04\x01\x02\x03\x06\t\b\a\x04\x01"
                               [(int)uVar5],player->grid);
        if (_Var3) {
          if ((!bVar1) || (bVar2)) {
            if ((bVar2) && (!bVar1)) {
              run_old_dir = (wchar_t)"\x01\x02\x03\x06\t\b\a\x04\x01\x02\x03\x06\t\b\a\x04\x01"
                                     [(int)(uVar5 + 2)];
            }
          }
          else {
            run_old_dir = (wchar_t)"\x01\x02\x03\x06\t\b\a\x04\x01\x02\x03\x06\t\b\a\x04\x01"
                                   [(int)(uVar5 - 2)];
          }
        }
      }
      else if ((local_19 == false) || (local_1a != false)) {
        if ((local_1a != false) && (local_19 == false)) {
          run_old_dir = (wchar_t)"\x01\x02\x03\x06\t\b\a\x04\x01\x02\x03\x06\t\b\a\x04\x01"
                                 [(int)(uVar5 + 1)];
        }
      }
      else {
        run_old_dir = (wchar_t)"\x01\x02\x03\x06\t\b\a\x04\x01\x02\x03\x06\t\b\a\x04\x01"
                               [(int)(uVar5 - 1)];
      }
    }
  }
  return;
}

Assistant:

static void run_init(int dir)
{
	int i;
	struct loc grid;

	bool deepleft, deepright;
	bool shortleft, shortright;

	/* Mark that we're starting a run */
	player->upkeep->running_firststep = true;

	/* Save the direction */
	run_cur_dir = dir;

	/* Assume running straight */
	run_old_dir = dir;

	/* If it's wilderness, done -NRM- */
	if ((level_topography(player->place) != TOP_CAVE) &&
		(level_topography(player->place) != TOP_TOWN))
		return;

	/* Assume looking for open area */
	run_open_area = true;

	/* Assume not looking for breaks */
	run_break_right = false;
	run_break_left = false;

	/* Assume no nearby walls */
	deepleft = deepright = false;
	shortright = shortleft = false;

	/* Find the destination grid */
	grid = loc_sum(player->grid, ddgrid[dir]);

	/* Extract cycle index */
	i = chome[dir];

	/* Check for nearby or distant wall */
	if (see_wall(cycle[i + 1], player->grid)) {
		/* Wall diagonally left of player's current grid */
		run_break_left = true;
		shortleft = true;
	} else if (see_wall(cycle[i + 1], grid)) {
		/* Wall diagonally left of the grid the player is stepping to */
		run_break_left = true;
		deepleft = true;
	}

	/* Check for nearby or distant wall */
	if (see_wall(cycle[i - 1], player->grid)) {
		/* Wall diagonally right of player's current grid */
		run_break_right = true;
		shortright = true;
	} else if (see_wall(cycle[i - 1], grid)) {
		/* Wall diagonally right of the grid the player is stepping to */
		run_break_right = true;
		deepright = true;
	}

	/* Looking for a break */
	if (run_break_left && run_break_right) {
		/* Not looking for open area */
		run_open_area = false;

		/* Check angled or blunt corridor entry for diagonal directions */
		if (dir & 0x01) {
			if (deepleft && !deepright)
				run_old_dir = cycle[i - 1];
			else if (deepright && !deepleft)
				run_old_dir = cycle[i + 1];
		} else if (see_wall(cycle[i], player->grid)) {
			if (shortleft && !shortright)
				run_old_dir = cycle[i - 2];
			else if (shortright && !shortleft)
				run_old_dir = cycle[i + 2];
		}
	}
}